

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<unsigned_long,_16UL>::reserve
          (ArrayWithPreallocation<unsigned_long,_16UL> *this,size_t minSize)

{
  long lVar1;
  ulong uVar2;
  void *pvVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  
  if (*(ulong *)(this + 0x10) < minSize) {
    uVar5 = minSize + 0xf & 0xfffffffffffffff0;
    if (0x10 < uVar5) {
      pvVar3 = operator_new__(uVar5 * 8);
      lVar1 = *(long *)this;
      uVar2 = *(ulong *)(this + 8);
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
        *(undefined8 *)((long)pvVar3 + uVar4 * 8) = *(undefined8 *)(lVar1 + uVar4 * 8);
      }
      freeIfHeapAllocated(this);
      *(void **)this = pvVar3;
    }
    *(ulong *)(this + 0x10) = uVar5;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }